

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::BuildInlineExportMap(WatWriter *this)

{
  bool bVar1;
  vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *this_00;
  reference ppEVar2;
  pair<std::pair<wabt::ExternalKind,_unsigned_int>,_wabt::Export_*> local_50;
  pair<wabt::ExternalKind,_unsigned_int> local_3c;
  pair<wabt::ExternalKind,_unsigned_int> key;
  Index index;
  Export *export_;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *__range2;
  WatWriter *this_local;
  
  if ((this->options_->inline_export & 1U) != 0) {
    this_00 = &((this->super_ModuleContext).module)->exports;
    __end2 = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::begin(this_00);
    export_ = (Export *)std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                                       *)&export_), bVar1) {
      ppEVar2 = __gnu_cxx::
                __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                ::operator*(&__end2);
      unique0x00012000 = *ppEVar2;
      key.first = ~First;
      if (((this->options_->inline_import & 1U) != 0) ||
         (bVar1 = Module::IsImport((this->super_ModuleContext).module,unique0x00012000), !bVar1)) {
        switch(stack0xffffffffffffffd0->kind) {
        case First:
          key.first = Module::GetFuncIndex
                                ((this->super_ModuleContext).module,&stack0xffffffffffffffd0->var);
          break;
        case Table:
          key.first = Module::GetTableIndex
                                ((this->super_ModuleContext).module,&stack0xffffffffffffffd0->var);
          break;
        case Memory:
          key.first = Module::GetMemoryIndex
                                ((this->super_ModuleContext).module,&stack0xffffffffffffffd0->var);
          break;
        case Global:
          key.first = Module::GetGlobalIndex
                                ((this->super_ModuleContext).module,&stack0xffffffffffffffd0->var);
          break;
        case Event:
          key.first = Module::GetEventIndex
                                ((this->super_ModuleContext).module,&stack0xffffffffffffffd0->var);
        }
        if (key.first != ~First) {
          local_3c = std::make_pair<wabt::ExternalKind&,unsigned_int&>
                               (&stack0xffffffffffffffd0->kind,&key.first);
          local_50 = std::make_pair<std::pair<wabt::ExternalKind,unsigned_int>&,wabt::Export*&>
                               (&local_3c,(Export **)&key.second);
          std::
          multimap<std::pair<wabt::ExternalKind,unsigned_int>,wabt::Export_const*,std::less<std::pair<wabt::ExternalKind,unsigned_int>>,std::allocator<std::pair<std::pair<wabt::ExternalKind,unsigned_int>const,wabt::Export_const*>>>
          ::insert<std::pair<std::pair<wabt::ExternalKind,unsigned_int>,wabt::Export*>>
                    ((multimap<std::pair<wabt::ExternalKind,unsigned_int>,wabt::Export_const*,std::less<std::pair<wabt::ExternalKind,unsigned_int>>,std::allocator<std::pair<std::pair<wabt::ExternalKind,unsigned_int>const,wabt::Export_const*>>>
                      *)&this->inline_export_map_,&local_50);
        }
      }
      __gnu_cxx::
      __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void WatWriter::BuildInlineExportMap() {
  if (!options_.inline_export) {
    return;
  }

  for (Export* export_ : module.exports) {
    Index index = kInvalidIndex;

    // Exported imports can't be written with inline exports, unless the
    // imports are also inline. For example, the following is invalid:
    //
    //   (import "module" "field" (func (export "e")))
    //
    // But this is valid:
    //
    //   (func (export "e") (import "module" "field"))
    //
    if (!options_.inline_import && module.IsImport(*export_)) {
      continue;
    }

    switch (export_->kind) {
      case ExternalKind::Func:
        index = module.GetFuncIndex(export_->var);
        break;

      case ExternalKind::Table:
        index = module.GetTableIndex(export_->var);
        break;

      case ExternalKind::Memory:
        index = module.GetMemoryIndex(export_->var);
        break;

      case ExternalKind::Global:
        index = module.GetGlobalIndex(export_->var);
        break;

      case ExternalKind::Event:
        index = module.GetEventIndex(export_->var);
        break;
    }

    if (index != kInvalidIndex) {
      auto key = std::make_pair(export_->kind, index);
      inline_export_map_.insert(std::make_pair(key, export_));
    }
  }
}